

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O2

void mcpl_internal_buf_reserve(mcpl_buffer_t *buf,size_t n)

{
  char *__src;
  char *__dest;
  
  if (buf->capacity < n) {
    __src = buf->buf;
    __dest = mcpl_internal_malloc(n);
    memcpy(__dest,__src,buf->size);
    buf->buf = __dest;
    buf->capacity = n;
    free(__src);
    return;
  }
  return;
}

Assistant:

MCPL_LOCAL void mcpl_internal_buf_reserve(mcpl_buffer_t* buf, size_t n)
{
  if ( n <= buf->capacity )
    return;
  char * oldbuf = buf->buf;
  char * newbuf = mcpl_internal_malloc( n );
  memcpy( newbuf, oldbuf, buf->size );
  buf->buf = newbuf;
  buf->capacity = n;
  free(oldbuf);
}